

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O3

uint __thiscall
ON_3dPointListRef::GetPoints
          (ON_3dPointListRef *this,int point_index_count,int *point_index_list,
          ON_SimpleArray<ON_3dPoint> *points)

{
  uint uVar1;
  
  if (point_index_count < 1) {
    uVar1 = 0;
  }
  else {
    uVar1 = GetPoints(this,point_index_count,(uint *)point_index_list,points);
  }
  if (((uVar1 < (uint)points->m_count) && (-1 < (int)uVar1)) && ((int)uVar1 <= points->m_capacity))
  {
    points->m_count = uVar1;
  }
  return uVar1;
}

Assistant:

unsigned int ON_3dPointListRef::GetPoints(
  int point_index_count,
  const int* point_index_list,
  ON_SimpleArray<ON_3dPoint>& points
  ) const
{
  unsigned int rc = (point_index_count > 0) 
                  ? GetPoints((unsigned int)point_index_count,(const unsigned int*)point_index_list,points) 
                  : 0;

  if (rc < points.UnsignedCount())
    points.SetCount(rc);

  return rc;
}